

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

int64_t __thiscall
aeron::archive::AeronArchive::pollForDescriptors
          (AeronArchive *this,int64_t correlationId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  char *pcVar1;
  byte bVar2;
  element_type *peVar3;
  ClientConductor *this_00;
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  shared_ptr<aeron::Subscription> *psVar7;
  size_t sVar8;
  long lVar9;
  SourcedException *this_01;
  char *pcVar10;
  nfds_t __nfds;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  nfds_t __nfds_00;
  nfds_t extraout_RDX_02;
  pollfd *__fds;
  char *pcVar11;
  long lVar12;
  int32_t iVar13;
  undefined1 auVar14 [16];
  allocator local_c5;
  int local_c4;
  int64_t local_c0;
  long local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8 = std::chrono::_V2::system_clock::now();
  lVar12 = (this->messageTimeoutNs_).__r;
  __fds = (pollfd *)correlationId;
  RecordingDescriptorPoller::reset
            ((this->recordingDescriptorPoller_)._M_t.
             super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             ._M_t.
             super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl
             ,correlationId,recordCount,consumer);
  iVar5 = RecordingDescriptorPoller::poll
                    ((this->recordingDescriptorPoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                     .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                     _M_head_impl,__fds,__nfds,(int)consumer);
  iVar6 = RecordingDescriptorPoller::remainingRecordCount
                    ((this->recordingDescriptorPoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                     .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                     _M_head_impl);
  bVar4 = RecordingDescriptorPoller::isDispatchComplete
                    ((this->recordingDescriptorPoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                     .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                     _M_head_impl);
  local_c4 = recordCount;
  if (!bVar4) {
    lVar12 = lVar12 + local_b8;
    __nfds_00 = extraout_RDX;
    iVar13 = iVar6;
    local_c0 = correlationId;
    do {
      if (recordCount != iVar13) {
        auVar14 = std::chrono::_V2::system_clock::now();
        __nfds_00 = auVar14._8_8_;
        lVar12 = auVar14._0_8_ + (this->messageTimeoutNs_).__r;
      }
      peVar3 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3->m_conductorInvoker).m_isRunning == true) {
        this_00 = (peVar3->m_conductorInvoker).m_agent;
        DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                  (&this_00->m_driverListenerAdapter);
        ClientConductor::onHeartbeatCheckTimeouts(this_00);
        __nfds_00 = extraout_RDX_00;
      }
      if (iVar5 < 1) {
        psVar7 = RecordingDescriptorPoller::subscription
                           ((this->recordingDescriptorPoller_)._M_t.
                            super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                            .
                            super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>
                            ._M_head_impl);
        consumer = (RecordingDescriptorConsumer *)
                   (((psVar7->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_imageList)._M_b._M_p;
        sVar8 = *(size_t *)((long)&(consumer->super__Function_base)._M_functor + 8);
        if (sVar8 != 0) {
          consumer = (RecordingDescriptorConsumer *)
                     &(*(Image **)&(consumer->super__Function_base)._M_functor)->m_isClosed;
          do {
            sVar8 = sVar8 - 1;
            bVar2 = (consumer->super__Function_base)._M_functor._M_pod_data[0];
            __fds = (pollfd *)CONCAT71((int7)((ulong)__fds >> 8),bVar2);
            if ((bVar2 & 1) == 0) break;
            consumer = (RecordingDescriptorConsumer *)
                       ((long)&consumer[9].super__Function_base._M_functor._M_unused + 8);
          } while (sVar8 != 0);
        }
        lVar9 = std::chrono::_V2::system_clock::now();
        if (lVar12 < lVar9) {
          this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_b0,local_c0);
          std::operator+(&local_50,"awaiting recording descriptors: correlationId=",&local_b0);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,
                     "std::int64_t aeron::archive::AeronArchive::pollForDescriptors(std::int64_t, std::int32_t, RecordingDescriptorConsumer &&)"
                     ,"");
          pcVar11 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
          ;
          pcVar10 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
          ;
          do {
            pcVar10 = pcVar10 + 1;
            pcVar1 = pcVar11 + 1;
            pcVar11 = pcVar11 + 1;
          } while (*pcVar10 == *pcVar1);
          std::__cxx11::string::string((string *)&local_70,pcVar11 + (*pcVar1 == '/'),&local_c5);
          aeron::util::SourcedException::SourcedException
                    (this_01,&local_50,&local_90,&local_70,0x1b4);
          *(undefined ***)this_01 = &PTR__SourcedException_00163260;
          __cxa_throw(this_01,&ArchiveException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        sched_yield();
        __nfds_00 = extraout_RDX_01;
      }
      iVar5 = RecordingDescriptorPoller::poll
                        ((this->recordingDescriptorPoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                         _M_head_impl,__fds,__nfds_00,(int)consumer);
      iVar6 = RecordingDescriptorPoller::remainingRecordCount
                        ((this->recordingDescriptorPoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                         _M_head_impl);
      bVar4 = RecordingDescriptorPoller::isDispatchComplete
                        ((this->recordingDescriptorPoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                         _M_head_impl);
      __nfds_00 = extraout_RDX_02;
      recordCount = iVar13;
      iVar13 = iVar6;
    } while (!bVar4);
  }
  return (long)(local_c4 - iVar6);
}

Assistant:

std::int64_t AeronArchive::pollForDescriptors(std::int64_t correlationId, std::int32_t recordCount,
                                              RecordingDescriptorConsumer&& consumer) {
    std::int32_t existingRemainCount = recordCount;
    auto deadline = Clock::now() + messageTimeoutNs_;

    recordingDescriptorPoller_->reset(correlationId, recordCount, std::move(consumer));

    while (true) {
        std::int32_t fragments = recordingDescriptorPoller_->poll();
        std::int32_t remainingRecordCount = recordingDescriptorPoller_->remainingRecordCount();

        if (recordingDescriptorPoller_->isDispatchComplete()) {
            return recordCount - remainingRecordCount;
        }

        if (existingRemainCount != remainingRecordCount) {
            existingRemainCount = remainingRecordCount;
            deadline = Clock::now() + messageTimeoutNs_;
        }

        aeron_->conductorAgentInvoker().invoke();

        if (fragments > 0) {
            continue;
        }

        if (!recordingDescriptorPoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting recording descriptors: correlationId=" + std::to_string(correlationId),
                                   SOURCEINFO);
        }

        idleStrategy_.idle();
    }
}